

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Action::~Action(Action *this)

{
  this->_vptr_Action = (_func_int **)&PTR__Action_013e4478;
  std::__cxx11::string::~string((string *)&this->name);
  Var::~Var(&this->module_var);
  return;
}

Assistant:

virtual ~Action() = default;